

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuTargetNameFunc(sqlite3_context *pCtx,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  int iVar2;
  int *__s;
  size_t sVar3;
  i64 iVar4;
  
  pvVar1 = pCtx->pFunc->pUserData;
  __s = (int *)sqlite3ValueText(*argv,'\x01');
  if (__s != (int *)0x0) {
    if (*(long *)((long)pvVar1 + 0x18) == 0) {
      if ((argc == 1) || (iVar4 = sqlite3VdbeIntValue(argv[1]), (int)iVar4 == 0)) {
LAB_001e7a16:
        setResultStrOrError(pCtx,(char *)__s,-1,'\x01',(_func_void_void_ptr *)0x0);
        return;
      }
    }
    else {
      sVar3 = strlen((char *)__s);
      if ((4 < sVar3) && (*__s == 0x61746164)) {
        __s = __s + 1;
        do {
          iVar2 = *__s;
          __s = (int *)((long)__s + 1);
        } while ((byte)((char)iVar2 - 0x30U) < 10);
        if (((char)iVar2 == '_') && (*(char *)__s != '\0')) goto LAB_001e7a16;
      }
    }
  }
  return;
}

Assistant:

static void rbuTargetNameFunc(
  sqlite3_context *pCtx,
  int argc,
  sqlite3_value **argv
){
  sqlite3rbu *p = sqlite3_user_data(pCtx);
  const char *zIn;
  assert( argc==1 || argc==2 );

  zIn = (const char*)sqlite3_value_text(argv[0]);
  if( zIn ){
    if( rbuIsVacuum(p) ){
      if( argc==1 || 0==sqlite3_value_int(argv[1]) ){
        sqlite3_result_text(pCtx, zIn, -1, SQLITE_STATIC);
      }
    }else{
      if( strlen(zIn)>4 && memcmp("data", zIn, 4)==0 ){
        int i;
        for(i=4; zIn[i]>='0' && zIn[i]<='9'; i++);
        if( zIn[i]=='_' && zIn[i+1] ){
          sqlite3_result_text(pCtx, &zIn[i+1], -1, SQLITE_STATIC);
        }
      }
    }
  }
}